

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing.cpp
# Opt level: O2

void wasm::UniqueNameMapper::uniquify(Expression *curr)

{
  TaskFunc p_Var1;
  TaskFunc_conflict p_Var2;
  char *pcVar3;
  Walker local_3b8;
  undefined1 auStack_1e8 [8];
  DuplicateNameScanner scanner;
  Expression *local_20;
  Expression *curr_local;
  
  auStack_1e8 = (undefined1  [8])0x0;
  scanner.
  super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  .replacep = (Expression **)0x0;
  scanner.
  super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  .stack.fixed._M_elems[9].currp = (Expression **)0x0;
  scanner.
  super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  scanner.
  super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  scanner.
  super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  scanner.
  super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  .currFunction = (Function *)0x0;
  scanner.
  super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  .currModule._0_1_ = '\x01';
  local_20 = curr;
  memset(&scanner.ok,0,0xa8);
  scanner.seen.
  super_SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
  .fixed.super_FixedStorageBase<wasm::Name,_10UL>.storage._M_elems[9].super_IString.str._M_str =
       (char *)&scanner.seen.
                super_SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
                .flexible._M_h._M_rehash_policy._M_next_resize;
  scanner.seen.
  super_SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
  .flexible._M_h._M_buckets = (__buckets_ptr)0x1;
  scanner.seen.
  super_SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
  .flexible._M_h._M_bucket_count = 0;
  scanner.seen.
  super_SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
  .flexible._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  scanner.seen.
  super_SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
  .flexible._M_h._M_element_count._0_4_ = 0x3f800000;
  scanner.seen.
  super_SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
  .flexible._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  scanner.seen.
  super_SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
  .flexible._M_h._M_rehash_policy._4_4_ = 0;
  scanner.seen.
  super_SmallSetBase<wasm::Name,_10UL,_wasm::UnorderedFixedStorage<wasm::Name,_10UL>,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>
  .flexible._M_h._M_rehash_policy._M_next_resize = 0;
  Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
  ::pushTask((Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
              *)auStack_1e8,
             PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
             ::scan,&local_20);
  do {
    if (((long)scanner.
               super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
               .
               super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
               .stack.flexible.
               super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start -
         (long)scanner.
               super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
               .
               super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
               .stack.fixed._M_elems[9].currp >> 4) +
        (long)scanner.
              super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
              .
              super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
              .replacep == 0) {
      if ((char)scanner.
                super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                .currModule == '\0') {
        local_3b8.mapper.labelMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_3b8.mapper.labelMappings._M_t._M_impl.super__Rb_tree_header._M_header;
        local_3b8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep =
             (Expression **)0x0;
        local_3b8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.usedFixed = 0;
        local_3b8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3b8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_3b8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.currFunction =
             (Function *)0x0;
        local_3b8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.currModule =
             (Module *)0x0;
        local_3b8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        controlFlowStack.usedFixed = 0;
        local_3b8.mapper.labelMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             _S_red;
        local_3b8.mapper.labelMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        local_3b8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        controlFlowStack.flexible.
        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        controlFlowStack.flexible.
        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3b8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
        controlFlowStack.flexible.
        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_3b8.mapper.labelStack.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8.mapper.labelStack.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3b8.mapper.labelStack.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_3b8.mapper.labelMappings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_3b8.mapper.reverseLabelMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_3b8.mapper.reverseLabelMapping._M_t._M_impl.super__Rb_tree_header._M_header;
        local_3b8.mapper.reverseLabelMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             _S_red;
        local_3b8.mapper.reverseLabelMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
             = (_Base_ptr)0x0;
        local_3b8.mapper.reverseLabelMapping._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_3b8.mapper.otherIndex = 0;
        local_3b8.mapper.labelMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_3b8.mapper.labelMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_3b8.mapper.reverseLabelMapping._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_3b8.mapper.reverseLabelMapping._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_left;
        Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::pushTask
                  ((Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_> *)&local_3b8,
                   ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::scan,
                   &local_20);
        while( true ) {
          if (((long)local_3b8.
                     super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                     super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                     super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.
                     flexible.
                     super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_3b8.
                     super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                     super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                     super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.
                     flexible.
                     super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) +
              local_3b8.
              super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
              super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
              super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.usedFixed ==
              0) break;
          if (local_3b8.
              super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
              super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
              super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
              super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_3b8.
              super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
              super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
              super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
              super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            if (local_3b8.
                super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.usedFixed
                == 0) {
              pcVar3 = 
              "T &wasm::SmallVector<wasm::Walker<Walker, wasm::UnifiedExpressionVisitor<Walker>>::Task, 10>::back() [T = wasm::Walker<Walker, wasm::UnifiedExpressionVisitor<Walker>>::Task, N = 10]"
              ;
LAB_00caadaa:
              __assert_fail("usedFixed > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                            ,0x7e,pcVar3);
            }
            p_Var2 = local_3b8.
                     super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                     super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                     super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.fixed
                     ._M_elems[local_3b8.
                               super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                               .
                               super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                               .super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                               stack.usedFixed - 1].func;
            local_3b8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
            .super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
            super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep =
                 local_3b8.
                 super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                 super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                 super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.fixed.
                 _M_elems[local_3b8.
                          super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
                          .super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                          super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.
                          usedFixed - 1].currp;
            local_3b8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
            .super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
            super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.usedFixed =
                 local_3b8.
                 super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                 super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                 super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.usedFixed
                 - 1;
          }
          else {
            p_Var2 = (TaskFunc_conflict)
                     local_3b8.
                     super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                     super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                     super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.
                     flexible.
                     super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].func;
            local_3b8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
            .super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
            super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep =
                 local_3b8.
                 super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                 super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                 super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
                 super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].currp;
            local_3b8.super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>
            .super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
            super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
            super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_3b8.
                 super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                 super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                 super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.stack.flexible.
                 super__Vector_base<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task,_std::allocator<wasm::Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
          }
          if (*local_3b8.
               super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
               super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
               super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep ==
              (Expression *)0x0) {
            pcVar3 = 
            "void wasm::Walker<Walker, wasm::UnifiedExpressionVisitor<Walker>>::walk(Expression *&) [SubType = Walker, VisitorType = wasm::UnifiedExpressionVisitor<Walker>]"
            ;
LAB_00caad74:
            __assert_fail("*task.currp",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                          ,0x132,pcVar3);
          }
          (*p_Var2)((Walker *)&local_3b8,
                    local_3b8.
                    super_ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                    super_PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.
                    super_Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>.replacep);
        }
        uniquify::Walker::~Walker(&local_3b8);
      }
      anon_unknown_23::DuplicateNameScanner::~DuplicateNameScanner
                ((DuplicateNameScanner *)auStack_1e8);
      return;
    }
    if ((pointer)scanner.
                 super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                 .stack.fixed._M_elems[9].currp ==
        scanner.
        super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
        .stack.flexible.
        super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      if (scanner.
          super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
          .replacep == (Expression **)0x0) {
        pcVar3 = 
        "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::DuplicateNameScanner, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::DuplicateNameScanner>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::DuplicateNameScanner, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::DuplicateNameScanner>>::Task, N = 10]"
        ;
        goto LAB_00caadaa;
      }
      p_Var1 = *(TaskFunc *)
                ((long)(&scanner.
                         super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                         .
                         super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                         .stack.fixed + -1) + 0x88 +
                (long)scanner.
                      super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                      .replacep * 0x10);
      auStack_1e8 = *(undefined1 (*) [8])
                     ((long)(&scanner.
                              super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                              .
                              super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                              .stack.fixed + -1) + 0x90 +
                     (long)scanner.
                           super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                           .
                           super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                           .replacep * 0x10);
      scanner.
      super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
      .replacep = (Expression **)
                  ((long)scanner.
                         super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                         .
                         super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                         .replacep + -1);
    }
    else {
      p_Var1 = scanner.
               super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
               .
               super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
               .stack.flexible.
               super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start[-1].func;
      auStack_1e8 = (undefined1  [8])
                    scanner.
                    super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
                    .stack.flexible.
                    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start[-1].currp;
      scanner.
      super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start =
           scanner.
           super_PostWalker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
           .
           super_Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>
           .stack.flexible.
           super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::DuplicateNameScanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::DuplicateNameScanner,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start + -1;
    }
    if (*(Expression **)auStack_1e8 == (Expression *)0x0) {
      pcVar3 = 
      "void wasm::Walker<wasm::(anonymous namespace)::DuplicateNameScanner, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::DuplicateNameScanner>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::DuplicateNameScanner, VisitorType = wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::DuplicateNameScanner>]"
      ;
      goto LAB_00caad74;
    }
    (*p_Var1)((DuplicateNameScanner *)auStack_1e8,(Expression **)auStack_1e8);
  } while( true );
}

Assistant:

void UniqueNameMapper::uniquify(Expression* curr) {
  // First, scan the code to see if anything needs to be fixed up, since in the
  // common case nothing needs fixing, and we can verify that very quickly.
  DuplicateNameScanner scanner;
  scanner.walk(curr);
  if (scanner.ok) {
    return;
  }

  struct Walker
    : public ControlFlowWalker<Walker, UnifiedExpressionVisitor<Walker>> {
    UniqueNameMapper mapper;

    static void doPreVisitControlFlow(Walker* self, Expression** currp) {
      BranchUtils::operateOnScopeNameDefs(*currp, [&](Name& name) {
        if (name.is()) {
          name = self->mapper.pushLabelName(name);
        }
      });
    }

    static void doPostVisitControlFlow(Walker* self, Expression** currp) {
      BranchUtils::operateOnScopeNameDefs(*currp, [&](Name& name) {
        if (name.is()) {
          self->mapper.popLabelName(name);
        }
      });
    }

    void visitExpression(Expression* curr) {
      BranchUtils::operateOnScopeNameUses(curr, [&](Name& name) {
        if (name.is()) {
          name = mapper.sourceToUnique(name);
        }
      });
    }
  } walker;

  walker.walk(curr);
}